

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_e65b53::HandleGlobalMode
               (cmExecutionStatus *status,string *name,OutType infoType,string *variable,
               string *propertyName)

{
  cmMakefile *makefile;
  cmake *pcVar1;
  cmValue value;
  long *local_48 [2];
  long local_38 [2];
  
  if (name == (string *)0x0) {
    pcVar1 = cmMakefile::GetCMakeInstance(status->Makefile);
    makefile = status->Makefile;
    value = cmState::GetGlobalProperty
                      ((pcVar1->State)._M_t.
                       super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                       super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                       super__Head_base<0UL,_cmState_*,_false>._M_head_impl,propertyName);
    StoreResult<cmValue>(infoType,makefile,variable,value);
  }
  else {
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,"given name for GLOBAL scope.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
  }
  return name == (string *)0x0;
}

Assistant:

bool HandleGlobalMode(cmExecutionStatus& status, const std::string& name,
                      OutType infoType, const std::string& variable,
                      const std::string& propertyName)
{
  if (!name.empty()) {
    status.SetError("given name for GLOBAL scope.");
    return false;
  }

  // Get the property.
  cmake* cm = status.GetMakefile().GetCMakeInstance();
  return StoreResult(infoType, status.GetMakefile(), variable,
                     cm->GetState()->GetGlobalProperty(propertyName));
}